

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void * yang_read_deviate(ly_ctx *ctx,lys_deviation *dev,LYS_DEVIATE_TYPE mod)

{
  lys_deviate *__ptr;
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  bVar1 = dev->deviate_size;
  uVar3 = (ulong)bVar1;
  uVar2 = (uint)bVar1;
  __ptr = dev->deviate;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    if (__ptr->mod == LY_DEVIATE_NO) {
      ly_vlog(ctx,LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"not-supported");
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "\"not-supported\" deviation cannot be combined with any other deviation.");
      return (void *)0x0;
    }
    if ((bVar1 & 7) != 0) goto LAB_00150512;
  }
  __ptr = (lys_deviate *)realloc(__ptr,(ulong)(uVar2 * 0x48 + 0x240));
  if (__ptr == (lys_deviate *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_deviate");
    return (void *)0x0;
  }
  bVar1 = dev->deviate_size;
  uVar3 = (ulong)bVar1;
  memset(__ptr + uVar3,0,0x240);
  dev->deviate = __ptr;
LAB_00150512:
  __ptr[uVar3].mod = mod;
  dev->deviate_size = bVar1 + 1;
  return __ptr + uVar3;
}

Assistant:

void *
yang_read_deviate(struct ly_ctx *ctx, struct lys_deviation *dev, LYS_DEVIATE_TYPE mod)
{
    struct lys_deviate *deviate;

    if (dev->deviate_size && dev->deviate[0].mod == LY_DEVIATE_NO) {
        LOGVAL(ctx, LYE_INSTMT, LY_VLOG_NONE, NULL, "not-supported");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "\"not-supported\" deviation cannot be combined with any other deviation.");
        return NULL;
    }
    if (!(dev->deviate_size % LY_YANG_ARRAY_SIZE)) {
        deviate = realloc(dev->deviate, (LY_YANG_ARRAY_SIZE + dev->deviate_size) * sizeof *deviate);
        LY_CHECK_ERR_RETURN(!deviate, LOGMEM(ctx), NULL);
        memset(deviate + dev->deviate_size, 0, LY_YANG_ARRAY_SIZE * sizeof *deviate);
        dev->deviate = deviate;
    }
    dev->deviate[dev->deviate_size].mod = mod;
    return &dev->deviate[dev->deviate_size++];
}